

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O0

void dit::loadImageRGBA8(TextureLevel *dst,Archive *archive,char *path)

{
  int width;
  int height;
  ConstPixelBufferAccess local_b0;
  PixelBufferAccess local_88;
  TextureFormat local_5c [2];
  undefined1 local_48 [8];
  TextureLevel tmp;
  char *path_local;
  Archive *archive_local;
  TextureLevel *dst_local;
  
  tmp.m_data.m_cap = (size_t)path;
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_48);
  tcu::ImageIO::loadImage((TextureLevel *)local_48,archive,(char *)tmp.m_data.m_cap);
  tcu::TextureFormat::TextureFormat(local_5c,RGBA,UNORM_INT8);
  width = tcu::TextureLevel::getWidth((TextureLevel *)local_48);
  height = tcu::TextureLevel::getHeight((TextureLevel *)local_48);
  tcu::TextureLevel::setStorage(dst,local_5c,width,height,1);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_88,dst);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_b0,(TextureLevel *)local_48);
  tcu::copy((EVP_PKEY_CTX *)&local_88,(EVP_PKEY_CTX *)&local_b0);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_48);
  return;
}

Assistant:

static void loadImageRGBA8 (tcu::TextureLevel& dst, const tcu::Archive& archive, const char* path)
{
	tcu::TextureLevel tmp;
	tcu::ImageIO::loadImage(tmp, archive, path);

	dst.setStorage(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), tmp.getWidth(), tmp.getHeight());
	tcu::copy(dst, tmp);
}